

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartialPiece
          (MessageBuilderGenerator *this,Printer *printer,int piece,int first_field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  undefined1 uVar1;
  CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>
  CVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Nonnull<char_*> pcVar7;
  ImmutableFieldGenerator *pIVar8;
  size_type sVar9;
  uint *puVar10;
  Nonnull<const_char_*> pcVar11;
  int index;
  int index_00;
  int index_01;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong v1;
  string_view text;
  string_view text_00;
  const_iterator other;
  string_view text_01;
  string_view text_02;
  iterator iVar15;
  string local_c8;
  int to_bitfield;
  undefined4 uStack_94;
  int local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  btree_set<int,_std::less<int>,_std::allocator<int>_> declared_to_bitfields;
  string local_50;
  
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&declared_to_bitfields,this->name_resolver_,this->descriptor_,true);
  buffer = &local_c8.field_2;
  pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer(piece,buffer->_M_local_buf);
  local_c8._M_dataplus._M_p = pcVar7 + -(long)buffer;
  local_c8._M_string_length = (size_type)buffer;
  _to_bitfield = (pointer)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&to_bitfield,buffer,pcVar7);
  GetBitFieldName_abi_cxx11_(&local_50,(java *)(ulong)(uint)piece,index);
  text._M_str = 
  "private void buildPartial$piece$($classname$ result) {\n  int from_$bit_field_name$ = $bit_field_name$;\n"
  ;
  text._M_len = 0x67;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[15],std::__cxx11::string>
            (printer,text,(char (*) [10])0x13005f3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &declared_to_bitfields,(char (*) [6])0x125ae1a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_bitfield,
             (char (*) [15])"bit_field_name",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_to_bitfield != &local_88) {
    operator_delete(_to_bitfield,local_88._M_allocated_capacity + 1);
  }
  if (declared_to_bitfields.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
      .tree_.root_ !=
      (node_type *)
      &declared_to_bitfields.
       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
       .
       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
       .tree_.size_) {
    operator_delete(declared_to_bitfields.
                    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .
                    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .tree_.root_,
                    declared_to_bitfields.
                    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .
                    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .tree_.size_ + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  declared_to_bitfields.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::EmptyNode()::empty_node;
  declared_to_bitfields.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             ::EmptyNode()::empty_node;
  declared_to_bitfields.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.size_ = 0;
  v1 = (ulong)(uint)first_field;
  lVar14 = v1 << 0x20;
  lVar12 = v1 * 0x58;
  iVar13 = 0;
  do {
    iVar5 = (int)v1;
    if (this->descriptor_->field_count_ <= iVar5) break;
    if (first_field < 0) {
      pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,lVar14 >> 0x20,"0 <= index");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar11);
LAB_00e6dbce:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c8);
    }
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(&this->descriptor_->fields_->super_SymbolBase + lVar12))
    ;
    iVar4 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[6])(pIVar8);
    iVar6 = this->descriptor_->field_count_;
    if (iVar6 <= iVar5) {
      pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (v1,(long)iVar6,"index < field_count()");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar11);
      goto LAB_00e6dbce;
    }
    bVar3 = IsRealOneof((FieldDescriptor *)(&this->descriptor_->fields_->super_SymbolBase + lVar12))
    ;
    if (!bVar3) {
      iVar6 = this->descriptor_->field_count_;
      if (iVar6 <= iVar5) {
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (v1,(long)iVar6,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar11);
        goto LAB_00e6dbce;
      }
      bVar3 = anon_unknown_16::BitfieldTracksMutability
                        ((FieldDescriptor *)(&this->descriptor_->fields_->super_SymbolBase + lVar12)
                        );
      if (!bVar3) {
        iVar5 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[6])();
        if (iVar5 != 0) {
          iVar5 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar8);
          if (0 < iVar5) {
            iVar6 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar8);
            iVar5 = iVar6 + 0x1f;
            if (-1 < iVar6) {
              iVar5 = iVar6;
            }
            to_bitfield = iVar5 >> 5;
            sVar9 = absl::lts_20250127::container_internal::
                    btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    ::count<int>((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                                  *)&declared_to_bitfields,&to_bitfield);
            if (sVar9 == 0) {
              GetBitFieldName_abi_cxx11_
                        (&local_c8,(java *)((ulong)_to_bitfield & 0xffffffff),index_00);
              text_00._M_str = "int to_$bit_field_name$ = 0;\n";
              text_00._M_len = 0x1d;
              io::Printer::Print<char[15],std::__cxx11::string>
                        (printer,text_00,(char (*) [15])"bit_field_name",&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              absl::lts_20250127::container_internal::
              btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
              ::insert_unique<int,int_const&>
                        ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
                          *)&local_c8,
                         (btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                          *)&declared_to_bitfields,&to_bitfield,&to_bitfield);
            }
          }
          (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar8,printer);
        }
      }
    }
    iVar13 = iVar13 + iVar4;
    v1 = v1 + 1;
    lVar14 = lVar14 + 0x100000000;
    lVar12 = lVar12 + 0x58;
  } while (iVar13 < 0x20);
  iVar15 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    *)&declared_to_bitfields);
  CVar2 = declared_to_bitfields.
          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
          .
          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
          .tree_.rightmost_;
  _to_bitfield = (pointer)iVar15.node_;
  local_90 = iVar15.position_;
  if (((ulong)declared_to_bitfields.
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .tree_.rightmost_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              .
              super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
              .value & 7) == 0) {
    uVar1 = *(undefined1 *)
             ((long)declared_to_bitfields.
                    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .
                    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .tree_.rightmost_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                    .
                    super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
                    .value + 10);
    while( true ) {
      other.position_._0_1_ = uVar1;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                     *)CVar2.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
                       .value;
      other._9_7_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
              ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                        *)&to_bitfield,other);
      if (bVar3) break;
      puVar10 = (uint *)absl::lts_20250127::container_internal::
                        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                        ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                                     *)&to_bitfield);
      GetBitFieldName_abi_cxx11_(&local_c8,(java *)(ulong)*puVar10,index_01);
      text_01._M_str = "result.$bit_field_name$ |= to_$bit_field_name$;\n";
      text_01._M_len = 0x30;
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,text_01,(char (*) [15])"bit_field_name",&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                   *)&to_bitfield);
    }
    io::Printer::Outdent(printer);
    text_02._M_str = "}\n\n";
    text_02._M_len = 3;
    io::Printer::Print<>(printer,text_02);
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
    ::~btree((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              *)&declared_to_bitfields);
    return (int)v1;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

int MessageBuilderGenerator::GenerateBuildPartialPiece(io::Printer* printer,
                                                       int piece,
                                                       int first_field) {
  printer->Print(
      "private void buildPartial$piece$($classname$ result) {\n"
      "  int from_$bit_field_name$ = $bit_field_name$;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_), "piece",
      absl::StrCat(piece), "bit_field_name", GetBitFieldName(piece));
  printer->Indent();
  absl::btree_set<int> declared_to_bitfields;

  int bit = 0;
  int next = first_field;
  for (; bit < 32 && next < descriptor_->field_count(); ++next) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(next));
    bit += field.GetNumBitsForBuilder();

    // Skip oneof fields that are handled separately
    if (IsRealOneof(descriptor_->field(next))) {
      continue;
    }

    // Skip repeated fields because they are currently handled
    // in separate buildPartial sub-methods.
    if (BitfieldTracksMutability(descriptor_->field(next))) {
      continue;
    }
    // Skip fields without presence bits in the builder
    if (field.GetNumBitsForBuilder() == 0) {
      continue;
    }

    // Track message bits if necessary
    if (field.GetNumBitsForMessage() > 0) {
      int to_bitfield = field.GetMessageBitIndex() / 32;
      if (declared_to_bitfields.count(to_bitfield) == 0) {
        printer->Print("int to_$bit_field_name$ = 0;\n", "bit_field_name",
                       GetBitFieldName(to_bitfield));
        declared_to_bitfields.insert(to_bitfield);
      }
    }

    // Copy the field from the builder to the message
    field.GenerateBuildingCode(printer);
  }

  // Copy the bit field results to the generated message
  for (int to_bitfield : declared_to_bitfields) {
    printer->Print("result.$bit_field_name$ |= to_$bit_field_name$;\n",
                   "bit_field_name", GetBitFieldName(to_bitfield));
  }

  printer->Outdent();
  printer->Print("}\n\n");

  return next;
}